

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel.cpp
# Opt level: O0

void __thiscall
TPZGraphEl::TPZGraphEl
          (TPZGraphEl *this,void **vtt,TPZCompEl *cel,TPZGraphMesh *gmesh,TPZGraphNode **connectvec)

{
  int iVar1;
  TPZGraphNode **ppTVar2;
  TPZGeoEl *pTVar3;
  TPZConnect *this_00;
  int64_t iVar4;
  TPZAdmChunkVector<TPZGraphNode,_10> *this_01;
  int64_t iVar5;
  TPZChunkVector<TPZGraphEl_*,_10> *this_02;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *nelem;
  TPZGraphEl **ppTVar6;
  TPZGraphMesh *in_RCX;
  TPZCompEl *in_RDX;
  undefined8 *in_RSI;
  TPZAdmChunkVector<TPZGraphNode,_10> *in_RDI;
  long in_R8;
  int64_t index;
  int64_t newsize;
  TPZConnect *cn;
  int j;
  TPZGraphNode *gno;
  TPZGraphMesh *in_stack_ffffffffffffff00;
  TPZAdmChunkVector<TPZGraphEl_*,_10> *in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff18;
  TPZChunkVector<TPZGraphEl_*,_10> *in_stack_ffffffffffffff20;
  int local_44;
  
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,(void **)(in_RSI + 1));
  (in_RDI->super_TPZChunkVector<TPZGraphNode,_10>).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*in_RSI;
  (in_RDI->super_TPZChunkVector<TPZGraphNode,_10>).fNElements = (int64_t)in_RDX;
  (in_RDI->super_TPZChunkVector<TPZGraphNode,_10>).fVec.super_TPZVec<TPZGraphNode_*>._vptr_TPZVec =
       (_func_int **)in_RCX;
  ppTVar2 = (TPZGraphNode **)TPZCompEl::Index(in_RDX);
  (in_RDI->super_TPZChunkVector<TPZGraphNode,_10>).fVec.super_TPZVec<TPZGraphNode_*>.fStore =
       ppTVar2;
  local_44 = 0;
  while( true ) {
    pTVar3 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffff08);
    iVar1 = (**(code **)(*(long *)pTVar3 + 0xf0))();
    if (iVar1 <= local_44) break;
    this_00 = (TPZConnect *)(**(code **)(*(long *)in_RDX + 0xa8))(in_RDX,local_44);
    iVar4 = TPZConnect::SequenceNumber(this_00);
    this_01 = TPZGraphMesh::NodeMap(in_RCX);
    iVar5 = TPZChunkVector<TPZGraphNode,_10>::NElements
                      (&this_01->super_TPZChunkVector<TPZGraphNode,_10>);
    if (iVar5 < iVar4 + 1) {
      TPZGraphMesh::NodeMap(in_RCX);
      TPZAdmChunkVector<TPZGraphNode,_10>::Resize(in_RDI,(int)((ulong)in_RSI >> 0x20));
    }
    TPZGraphMesh::NodeMap(in_RCX);
    TPZConnect::SequenceNumber(this_00);
    this_02 = (TPZChunkVector<TPZGraphEl_*,_10> *)
              TPZChunkVector<TPZGraphNode,_10>::operator[]
                        ((TPZChunkVector<TPZGraphNode,_10> *)in_stack_ffffffffffffff20,
                         in_stack_ffffffffffffff18);
    iVar4 = TPZGraphNode::SequenceNumber((TPZGraphNode *)this_02);
    if (iVar4 == -1) {
      TPZGraphNode::SetElement((TPZGraphNode *)this_02,(TPZGraphEl *)in_RDI);
      in_stack_ffffffffffffff20 = this_02;
      iVar4 = TPZConnect::SequenceNumber(this_00);
      TPZGraphNode::SetSequenceNumber((TPZGraphNode *)in_stack_ffffffffffffff20,iVar4);
      TPZGraphNode::SetConnect((TPZGraphNode *)this_02,this_00);
      TPZGraphNode::SetGraphMesh((TPZGraphNode *)this_02,in_RCX);
    }
    *(TPZChunkVector<TPZGraphEl_*,_10> **)(in_R8 + (long)local_44 * 8) = this_02;
    local_44 = local_44 + 1;
  }
  nelem = TPZGraphMesh::ElementList(in_stack_ffffffffffffff00);
  TPZAdmChunkVector<TPZGraphEl_*,_10>::AllocateNewElement(in_stack_ffffffffffffff08);
  TPZGraphMesh::ElementList(in_stack_ffffffffffffff00);
  ppTVar6 = TPZChunkVector<TPZGraphEl_*,_10>::operator[](in_stack_ffffffffffffff20,(int64_t)nelem);
  *ppTVar6 = (TPZGraphEl *)in_RDI;
  return;
}

Assistant:

TPZGraphEl::TPZGraphEl(TPZCompEl *cel, TPZGraphMesh *gmesh, TPZGraphNode **connectvec)
{
	fCompEl = cel;
	fGraphMesh = gmesh;
	fId = cel->Index();
	TPZGraphNode *gno;
	for(int j = 0; j < cel->Reference()->NSides(); j++) {
		TPZConnect &cn = cel->Connect(j);
		int64_t newsize = cn.SequenceNumber()+1;
		if( gmesh->NodeMap().NElements() < newsize ) {
            gmesh->NodeMap().Resize(newsize);
		}
		gno = &gmesh->NodeMap()[cn.SequenceNumber()];
		if(gno->SequenceNumber() ==-1) {
			gno->SetElement(this);
			gno->SetSequenceNumber(cn.SequenceNumber());
			gno->SetConnect(&cn);
			gno->SetGraphMesh(gmesh);
		}
		connectvec[j] = gno;
	}
	int64_t index = gmesh->ElementList().AllocateNewElement();
	gmesh->ElementList()[index] = this;
}